

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O1

void __thiscall QWizard::setCurrentId(QWizard *this,int id)

{
  QWizardPrivate *this_00;
  char cVar1;
  bool bVar2;
  long in_FS_OFFSET;
  int local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWizardPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  local_1c = id;
  if (this_00->current != id && this_00->current != -1) {
    cVar1 = (**(code **)(*(long *)&(this->super_QDialog).super_QWidget + 0x1c8))();
    if (cVar1 != '\0') {
      if (-1 < local_1c) {
        bVar2 = QMap<int,_QWizardPage_*>::contains(&this_00->pageMap,&stack0xffffffffffffffe4);
        if (bVar2) {
          QWizardPrivate::switchToPage
                    (this_00,local_1c,
                     (uint)(*(int *)(*(long *)&(this->super_QDialog).super_QWidget.field_0x8 + 0x340
                                    ) <= local_1c));
          goto LAB_0051866b;
        }
      }
      setCurrentId((QWizard *)&stack0xffffffffffffffe4);
    }
  }
LAB_0051866b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizard::setCurrentId(int id)
{
    Q_D(QWizard);

    if (d->current == -1)
        return;

    if (currentId() == id)
        return;

    if (!validateCurrentPage())
        return;

    if (id < 0 || Q_UNLIKELY(!d->pageMap.contains(id))) {
        qWarning("QWizard::setCurrentId: No such page: %d", id);
        return;
    }

    d->switchToPage(id, (id < currentId()) ? QWizardPrivate::Backward : QWizardPrivate::Forward);
}